

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

string * CLI::detail::fix_newlines(string *__return_storage_ptr__,string *leader,string *input)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  bool bVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  ulong local_28;
  size_type n;
  string *input_local;
  string *leader_local;
  
  local_28 = 0;
  n = (size_type)input;
  input_local = leader;
  leader_local = __return_storage_ptr__;
  while( true ) {
    uVar1 = local_28;
    bVar4 = false;
    if (local_28 != 0xffffffffffffffff) {
      uVar2 = ::std::__cxx11::string::size();
      bVar4 = uVar1 < uVar2;
    }
    if (!bVar4) break;
    local_28 = ::std::__cxx11::string::find((char)input,10);
    if (local_28 != 0xffffffffffffffff) {
      ::std::__cxx11::string::substr((ulong)&local_88,(ulong)input);
      ::std::operator+(&local_68,&local_88,input_local);
      ::std::__cxx11::string::substr((ulong)&local_b8,(ulong)input);
      ::std::operator+(&local_48,&local_68,&local_b8);
      ::std::__cxx11::string::operator=((string *)input,(string *)&local_48);
      ::std::__cxx11::string::~string((string *)&local_48);
      ::std::__cxx11::string::~string((string *)&local_b8);
      ::std::__cxx11::string::~string((string *)&local_68);
      ::std::__cxx11::string::~string((string *)&local_88);
      lVar3 = ::std::__cxx11::string::size();
      local_28 = lVar3 + local_28;
    }
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  return __return_storage_ptr__;
}

Assistant:

inline std::string fix_newlines(const std::string &leader, std::string input) {
    std::string::size_type n = 0;
    while(n != std::string::npos && n < input.size()) {
        n = input.find('\n', n);
        if(n != std::string::npos) {
            input = input.substr(0, n + 1) + leader + input.substr(n + 1);
            n += leader.size();
        }
    }
    return input;
}